

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRalgorithm.cpp
# Opt level: O3

void ToHessenbergForm(Matrix *m)

{
  uint uVar1;
  double *now;
  undefined4 extraout_var;
  double *pdVar3;
  uint start;
  ulong uVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  Vector r;
  Vector w;
  allocator_type local_a9;
  double local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  Vector local_88;
  ulong local_70;
  ulong local_68;
  undefined8 local_60;
  int local_54;
  Vector local_50;
  value_type local_38;
  undefined8 uVar2;
  
  uVar1 = Matrix::GetCols(m);
  uVar2 = CONCAT44(extraout_var,uVar1);
  if (2 < (int)uVar1) {
    local_54 = uVar1 - 3;
    local_70 = 0;
    local_68 = 1;
    local_60 = uVar2;
    do {
      start = (int)local_70 + 1;
      iVar5 = (int)uVar2;
      Matrix::GetColPart(&local_50,m,(int)local_70,start,iVar5);
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_a0,
                 (long)(int)((ulong)((long)local_50.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_50.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3),&local_38,
                 &local_a9);
      local_a8 = *local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      dVar7 = Utils::EuclideanNorm(&local_50);
      *local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = dVar7 * (double)(int)((uint)(local_a8 < 0.0) - (uint)(0.0 < local_a8));
      Utils::SubVectors(&local_88,&local_50,&local_a0);
      dVar7 = Utils::EuclideanNorm(&local_88);
      uVar4 = local_70;
      for (pdVar3 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar3 != local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
        *pdVar3 = *pdVar3 / dVar7;
      }
      if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar6 = (long)(iVar5 - (int)((ulong)((long)local_88.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_88.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start) >> 3));
      if ((int)uVar4 < iVar5) {
        uVar4 = local_70 & 0xffffffff;
        do {
          iVar5 = (int)uVar4;
          Matrix::GetColPart(&local_a0,m,iVar5,start,(int)uVar2);
          dVar7 = Utils::ScalarMultiply(&local_88,&local_a0);
          if ((int)start < (int)local_60) {
            uVar4 = local_68;
            do {
              local_a8 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar4 - lVar6];
              pdVar3 = Matrix::operator()(m,(int)uVar4,iVar5);
              *pdVar3 = local_a8 * dVar7 * -2.0 + *pdVar3;
              uVar4 = uVar4 + 1;
            } while (uVar1 != uVar4);
          }
          if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (double *)0x0) {
            operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_a0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar4 = (ulong)(iVar5 + 1U);
          uVar2 = local_60;
        } while (iVar5 + 1U != (uint)local_60);
      }
      iVar5 = 0;
      do {
        Matrix::GetRowPart(&local_a0,m,iVar5,start,(int)uVar2);
        dVar7 = Utils::ScalarMultiply(&local_88,&local_a0);
        if ((int)start < (int)uVar2) {
          uVar4 = local_68;
          do {
            local_a8 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar4 - lVar6];
            pdVar3 = Matrix::operator()(m,iVar5,(int)uVar4);
            *pdVar3 = local_a8 * dVar7 * -2.0 + *pdVar3;
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
        if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        uVar2 = local_60;
        iVar5 = iVar5 + 1;
      } while (iVar5 != (int)local_60);
      if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_68 = local_68 + 1;
      iVar5 = (int)local_70;
      local_70 = (ulong)start;
    } while (iVar5 != local_54);
  }
  return;
}

Assistant:

void ToHessenbergForm(Matrix &m)
{
    int n = m.GetCols();

    for (int j = 0; j < n - 2; ++j)
    {
        Vector w = GetW(m.GetColPart(j, j + 1, n));
        int offset = n - w.size();

        // Transforming columns
        for (int column = j; column < n; ++column)
        {
            Vector colPart = m.GetColPart(column, j + 1, n);
            double dot = Utils::ScalarMultiply(w, colPart);
            for (int i = j + 1; i < n; ++i)
            {
                m(i, column) -= 2 * dot * w[i - offset];
            }
        }

        // Transforming rows
        for (int row = 0; row < n; ++row)
        {
            Vector rowPart = m.GetRowPart(row, j + 1, n);
            double dot = Utils::ScalarMultiply(w, rowPart);
            for (int i = j + 1; i < n; ++i)
            {
                m(row, i) -= 2 * dot * w[i - offset];
            }
        }
    }
}